

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifeFormAppearance.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::LifeFormAppearance::operator==(LifeFormAppearance *this,LifeFormAppearance *Value)

{
  return *this == *Value;
}

Assistant:

KBOOL LifeFormAppearance::operator == ( const LifeFormAppearance & Value ) const
{
    // Lets do a single comparison instead of checking every field. 
    // This struct is basically a KUINT32 so lets cast it to one and compare.

    KUINT32 a = *( KUINT32 * )this;
    KUINT32 b = *( KUINT32 * )&Value;

    if( a != b )return false;
    return true;
}